

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_edge_detection.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint8_t uVar2;
  undefined8 uVar3;
  UiWindowX11 *this;
  Point2d *point_00;
  long in_RSI;
  int in_EDI;
  exception *ex;
  const_iterator point_1;
  const_iterator point;
  PaintColor negativeColor;
  PaintColor positiveColor;
  UiWindowX11 window;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *positiveEdge;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *negativeEdge;
  EdgeDetection edgeDetection;
  EdgeParameter edgeParameter;
  Image image;
  Image original;
  string filePath;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  EdgeParameter *in_stack_fffffffffffffd20;
  Image *in_stack_fffffffffffffd28;
  EdgeDetectionBase<double> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  imageException *in_stack_fffffffffffffd40;
  PaintColor *color;
  string *in_stack_fffffffffffffd90;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  in_stack_fffffffffffffd98;
  UiWindowX11 *in_stack_fffffffffffffda0;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_258;
  PaintColor local_249;
  PaintColor local_245;
  PaintColor local_241 [54];
  Point2d *local_168;
  UiWindowX11 *local_160;
  EdgeDetectionBase<double> local_158;
  EdgeParameter local_128 [2];
  ImageTemplate<unsigned_char> local_e0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [64];
  ImageTemplate<unsigned_char> local_70;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mercury.bmp",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (1 < local_8) {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
  }
  Bitmap_Operation::Load
            ((string *)
             edgeDetection.negativeEdgePoint.
             super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(&local_70);
  if (!bVar1) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_e0);
    if (uVar2 != '\x01') {
      Image_Function::ConvertToGrayScale
                ((Image *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      PenguinV_Image::ImageTemplate<unsigned_char>::operator=
                ((ImageTemplate<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (ImageTemplate<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x103990);
    }
    uVar5 = 0;
    uVar4 = 0;
    EdgeParameter::EdgeParameter(local_128,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
    local_128[0].minimumContrast = '@';
    local_128[0].contrastCheckLeftSideOffset = 3;
    local_128[0].contrastCheckRightSideOffset = 3;
    EdgeDetectionBase<double>::EdgeDetectionBase
              ((EdgeDetectionBase<double> *)CONCAT44(in_stack_fffffffffffffd14,uVar5));
    EdgeDetectionBase<double>::find
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    this = (UiWindowX11 *)EdgeDetectionBase<double>::negativeEdge(&local_158);
    local_160 = this;
    point_00 = (Point2d *)EdgeDetectionBase<double>::positiveEdge(&local_158);
    color = local_241;
    local_168 = point_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_241[0].green,"Edge detection",(allocator *)color);
    UiWindowX11::UiWindowX11
              (in_stack_fffffffffffffda0,(Image *)in_stack_fffffffffffffd98._M_current,
               in_stack_fffffffffffffd90);
    std::__cxx11::string::~string((string *)&local_241[0].green);
    std::allocator<char>::~allocator((allocator<char> *)local_241);
    PaintColor::PaintColor(&local_245,'\x14',0xff,'\x14',0xff);
    PaintColor::PaintColor(&local_249,0xff,'\x14','\x14',0xff);
    local_258._M_current =
         (PointBase2D<double> *)
         std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
                   ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffd0c,uVar4));
    while( true ) {
      std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,uVar4));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd14,uVar5),
                         (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd0c,uVar4));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
      ::operator*(&local_258);
      UiWindowX11::drawPoint(this,point_00,color);
      __gnu_cxx::
      __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
      ::operator++(&local_258);
    }
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
              ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,uVar4));
    while( true ) {
      std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,uVar4));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd14,uVar5),
                         (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd0c,uVar4));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
      ::operator*((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                   *)&stack0xfffffffffffffd98);
      UiWindowX11::drawPoint(this,point_00,color);
      __gnu_cxx::
      __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
      ::operator++((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                    *)&stack0xfffffffffffffd98);
    }
    UiWindow::show((UiWindow *)0x103cd0);
    UiWindowX11::~UiWindowX11((UiWindowX11 *)CONCAT44(in_stack_fffffffffffffd14,uVar5));
    EdgeDetectionBase<double>::~EdgeDetectionBase
              ((EdgeDetectionBase<double> *)CONCAT44(in_stack_fffffffffffffd14,uVar5));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x103cf9);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x103d06);
    std::__cxx11::string::~string(local_30);
    return 0;
  }
  local_b2 = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Cannot load ",&local_b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  imageException::imageException(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_b2 = 0;
  __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    try // <---- do not forget to put your code into try.. catch block!
    {
        std::string filePath = "mercury.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        const PenguinV_Image::Image original = Bitmap_Operation::Load( filePath );

        if ( original.empty() ) // if the image is empty it means that the image doesn't exist or the file is not readable
            throw imageException( std::string("Cannot load ") + filePath );

        PenguinV_Image::Image image( original );
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE ) // convert to gray-scale image if it's not
            image = Image_Function::ConvertToGrayScale( image );

        EdgeParameter edgeParameter;
        edgeParameter.minimumContrast = 64u; // in intensity grades
        // We know that image would give a lot of false detected points due to single pixel intensity variations
        // In such case we set a range of pixels to verify that found edge point is really an edge
        edgeParameter.contrastCheckLeftSideOffset  = 3u; // in pixels
        edgeParameter.contrastCheckRightSideOffset = 3u; // in pixels

        EdgeDetection edgeDetection;
        edgeDetection.find( image, edgeParameter );

        const std::vector<Point2d> & negativeEdge = edgeDetection.negativeEdge();
        const std::vector<Point2d> & positiveEdge = edgeDetection.positiveEdge();

#if defined (_WIN32)
        UiWindowWin window( original, "Edge detection" );
#else
        UiWindowX11 window( original, "Edge detection" );
#endif

        const PaintColor positiveColor( 20, 255, 20 ); // green
        const PaintColor negativeColor( 255, 20, 20 ); // red

        for ( std::vector<Point2d>::const_iterator point = positiveEdge.cbegin(); point != positiveEdge.cend(); ++point )
            window.drawPoint( *point, positiveColor );

        for ( std::vector<Point2d>::const_iterator point = negativeEdge.cbegin(); point != negativeEdge.cend(); ++point )
            window.drawPoint( *point, negativeColor );

        window.show();
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    return 0;
}